

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Trivia::withLocation
          (Trivia *this,BumpAllocator *alloc,SourceLocation anchorLocation)

{
  FullLocation *pFVar1;
  ulong uVar2;
  string_view sVar3;
  Trivia TVar4;
  
  if ((byte)(this->kind - SkippedTokens) < 3) {
    pFVar1 = (FullLocation *)(this->field_0).rawText.ptr;
    uVar2 = *(ulong *)((long)&this->field_0 + 8);
  }
  else {
    pFVar1 = BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>(alloc);
    sVar3 = getRawText(this);
    pFVar1->text = sVar3;
    pFVar1->location =
         (SourceLocation)
         ((long)anchorLocation + sVar3._M_len * -0x10000000 & 0xfffffffff0000000 |
         (ulong)(anchorLocation._0_4_ & 0xfffffff));
    uVar2 = (ulong)this->kind << 0x28 | 0x100000000;
  }
  TVar4._8_8_ = uVar2;
  TVar4.field_0.fullLocation = pFVar1;
  return TVar4;
}

Assistant:

Trivia Trivia::withLocation(BumpAllocator& alloc, SourceLocation anchorLocation) const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return *this;
        default:
            break;
    }

    auto resultLocation = alloc.emplace<FullLocation>();
    resultLocation->text = getRawText();
    resultLocation->location = anchorLocation - resultLocation->text.size();

    Trivia result;
    result.kind = kind;
    result.hasFullLocation = true;
    result.fullLocation = resultLocation;
    return result;
}